

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)4,4>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  ulong in_RAX;
  ulong uVar3;
  u32 uVar4;
  u32 result;
  ulong uVar5;
  bool bVar6;
  u32 data;
  u32 ea;
  undefined8 local_38;
  
  uVar1 = (this->queue).irc;
  uVar4 = (this->reg).pc + 2;
  (this->reg).pc = uVar4;
  local_38 = in_RAX;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar4);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  uVar5 = (ulong)(uVar1 >> 0xc & 7);
  readOp<(moira::Core)2,(moira::Mode)4,4,0ull>
            (this,opcode & 7,(u32 *)((long)&local_38 + 4),(u32 *)&local_38);
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar5 * 4);
  switch(uVar1 >> 10 & 3) {
  case 0:
    uVar3 = (ulong)uVar2 * (local_38 & 0xffffffff);
    (this->reg).sr.n = (bool)((byte)(uVar3 >> 0x1f) & 1);
    (this->reg).sr.z = (int)uVar3 == 0;
    bVar6 = uVar3 >> 0x20 == 0;
    break;
  case 1:
    uVar3 = (ulong)uVar2 * (local_38 & 0xffffffff);
    (this->reg).sr.n = SUB81(uVar3 >> 0x3f,0);
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar3 >> 0x20);
    goto LAB_003db83f;
  case 2:
    uVar3 = (long)(int)uVar2 * (long)(int)(u32)local_38;
    (this->reg).sr.n = (bool)((byte)(uVar3 >> 0x1f) & 1);
    (this->reg).sr.z = (int)uVar3 == 0;
    bVar6 = (long)(int)uVar3 == uVar3;
    break;
  case 3:
    uVar3 = (long)(int)uVar2 * (long)(int)(u32)local_38;
    (this->reg).sr.n = SUB81(uVar3 >> 0x3f,0);
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar3 >> 0x20);
    goto LAB_003db83f;
  }
  (this->reg).sr.v = !bVar6;
  (this->reg).sr.c = false;
LAB_003db83f:
  *(int *)((long)&(this->reg).field_3 + uVar5 * 4) = (int)uVar3;
  return;
}

Assistant:

void
Moira::execMullMusashi(u16 opcode)
{
    u64 result;
    u32 ea, data;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    readOp<C, M, S>(src, &ea, &data);

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:

            result = mullu<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b01:

            result = mullu<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;

        case 0b10:

            result = mulls<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b11:

            result = mulls<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;
    }
}